

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O2

vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_> *
__thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,initializer_list<int> *collections,
          initializer_list<int> *collections_1,initializer_list<int> *collections_2)

{
  initializer_list<boost::iterator_range<const_int_*>_> values;
  iterator local_38;
  iterator local_30;
  iterator local_28;
  iterator local_20;
  iterator local_18;
  iterator local_10;
  
  local_38 = collections->_M_array;
  local_30 = local_38 + collections->_M_len;
  local_28 = collections_1->_M_array;
  local_20 = local_28 + collections_1->_M_len;
  local_18 = collections_2->_M_array;
  local_10 = local_18 + collections_2->_M_len;
  values._M_len = (size_type)local_10;
  values._M_array = (iterator)0x3;
  make_sequence_container<std::vector,_boost::iterator_range<const_int_*>_>
            (__return_storage_ptr__,(burst *)&local_38,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }